

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPathCommand.cxx
# Opt level: O3

string * __thiscall
cmFindPathCommand::FindNormalHeader_abi_cxx11_
          (string *__return_storage_ptr__,cmFindPathCommand *this)

{
  char cVar1;
  pointer pbVar2;
  pointer pbVar3;
  pointer pcVar4;
  bool bVar5;
  pointer pbVar6;
  pointer pbVar7;
  string tryPath;
  string local_58;
  string *local_38;
  
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  pbVar6 = (this->super_cmFindBase).Names.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (this->super_cmFindBase).Names.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    local_38 = __return_storage_ptr__;
    if (pbVar6 == pbVar2) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
LAB_001d3708:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,
                        CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                 local_58.field_2._M_local_buf[0]) + 1);
      }
      return __return_storage_ptr__;
    }
    pbVar3 = (this->super_cmFindBase).super_cmFindCommon.SearchPaths.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar7 = (this->super_cmFindBase).super_cmFindCommon.SearchPaths.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pbVar7 != pbVar3; pbVar7 = pbVar7 + 1)
    {
      std::__cxx11::string::_M_assign((string *)&local_58);
      std::__cxx11::string::_M_append((char *)&local_58,(ulong)(pbVar6->_M_dataplus)._M_p);
      bVar5 = cmsys::SystemTools::FileExists(&local_58);
      __return_storage_ptr__ = local_38;
      if (bVar5) {
        cVar1 = (this->super_cmFindBase).field_0x222;
        (local_38->_M_dataplus)._M_p = (pointer)&local_38->field_2;
        if (cVar1 == '\x01') {
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p == &local_58.field_2) {
            (local_38->field_2)._M_allocated_capacity =
                 CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                          local_58.field_2._M_local_buf[0]);
            *(undefined8 *)((long)&local_38->field_2 + 8) = local_58.field_2._8_8_;
          }
          else {
            (local_38->_M_dataplus)._M_p = local_58._M_dataplus._M_p;
            (local_38->field_2)._M_allocated_capacity =
                 CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                          local_58.field_2._M_local_buf[0]);
          }
          local_38->_M_string_length = local_58._M_string_length;
          local_58._M_string_length = 0;
          local_58.field_2._M_local_buf[0] = '\0';
          local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        }
        else {
          pcVar4 = (pbVar7->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_38,pcVar4,pcVar4 + pbVar7->_M_string_length);
        }
        goto LAB_001d3708;
      }
    }
    pbVar6 = pbVar6 + 1;
    __return_storage_ptr__ = local_38;
  } while( true );
}

Assistant:

std::string cmFindPathCommand::FindNormalHeader()
{
  std::string tryPath;
  for (std::string const& n : this->Names) {
    for (std::string const& sp : this->SearchPaths) {
      tryPath = sp;
      tryPath += n;
      if (cmSystemTools::FileExists(tryPath)) {
        if (this->IncludeFileInPath) {
          return tryPath;
        }
        return sp;
      }
    }
  }
  return "";
}